

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O2

int nn_sipc_send(nn_pipebase *self,nn_msg *msg)

{
  nn_msg *self_00;
  nn_chunkref *self_01;
  size_t sVar1;
  size_t sVar2;
  nn_fsm_event *pnVar3;
  nn_iovec iov [3];
  
  pnVar3 = &self[-3].in;
  if (self == (nn_pipebase *)0x0) {
    pnVar3 = (nn_fsm_event *)0x0;
  }
  if (((nn_ep_options *)(pnVar3 + 2))->ipv4only == 4) {
    if (*(int *)((long)(pnVar3 + 0x15) + 0x10) == 1) {
      self_00 = (nn_msg *)((long)(pnVar3 + 0x15) + 0x20);
      nn_msg_term(self_00);
      nn_msg_mv(self_00,msg);
      *(undefined1 *)((long)(pnVar3 + 0x15) + 0x14) = 1;
      sVar1 = nn_chunkref_size((nn_chunkref *)self_00);
      self_01 = (nn_chunkref *)((long)(pnVar3 + 0x17) + 0x10);
      sVar2 = nn_chunkref_size(self_01);
      nn_putll((uint8_t *)((long)(pnVar3 + 0x15) + 0x15),sVar1 + sVar2);
      iov[0].iov_len = 9;
      iov[0].iov_base = (void *)((long)(pnVar3 + 0x15) + 0x14);
      iov[1].iov_base = nn_chunkref_data((nn_chunkref *)self_00);
      iov[1].iov_len = nn_chunkref_size((nn_chunkref *)self_00);
      iov[2].iov_base = nn_chunkref_data(self_01);
      iov[2].iov_len = nn_chunkref_size(self_01);
      nn_usock_send(*(nn_usock **)((long)((nn_ep_options *)(pnVar3 + 2) + 1) + 4),iov,3);
      *(undefined4 *)((long)(pnVar3 + 0x15) + 0x10) = 2;
      return 0;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sipc->outstate == NN_SIPC_OUTSTATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0x84);
  }
  else {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",
            (ulong)(uint)((nn_ep_options *)(pnVar3 + 2))->ipv4only,"NN_SIPC_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0x83);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sipc_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sipc *sipc;
    struct nn_iovec iov [3];

    sipc = nn_cont (self, struct nn_sipc, pipebase);

    nn_assert_state (sipc, NN_SIPC_STATE_ACTIVE);
    nn_assert (sipc->outstate == NN_SIPC_OUTSTATE_IDLE);

    /*  Move the message to the local storage. */
    nn_msg_term (&sipc->outmsg);
    nn_msg_mv (&sipc->outmsg, msg);

    /*  Serialise the message header. */
    sipc->outhdr [0] = NN_SIPC_MSG_NORMAL;
    nn_putll (sipc->outhdr + 1, nn_chunkref_size (&sipc->outmsg.sphdr) +
        nn_chunkref_size (&sipc->outmsg.body));

    /*  Start async sending. */
    iov [0].iov_base = sipc->outhdr;
    iov [0].iov_len = sizeof (sipc->outhdr);
    iov [1].iov_base = nn_chunkref_data (&sipc->outmsg.sphdr);
    iov [1].iov_len = nn_chunkref_size (&sipc->outmsg.sphdr);
    iov [2].iov_base = nn_chunkref_data (&sipc->outmsg.body);
    iov [2].iov_len = nn_chunkref_size (&sipc->outmsg.body);
    nn_usock_send (sipc->usock, iov, 3);

    sipc->outstate = NN_SIPC_OUTSTATE_SENDING;

    return 0;
}